

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O3

void Js::ScopeInfo::SaveEnclosingScopeInfo(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  undefined4 *puVar4;
  FuncInfo *pFVar5;
  ScopeInfo *ptr;
  Scope *pSVar6;
  
  if ((funcInfo->byteCodeFunction != (ParseableFunctionInfo *)0x0) &&
     (pvVar3 = FunctionProxy::GetAuxPtr(&funcInfo->byteCodeFunction->super_FunctionProxy,ScopeInfo),
     pvVar3 != (void *)0x0)) {
    return;
  }
  pSVar6 = byteCodeGenerator->currentScope;
  if (pSVar6->func != funcInfo) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0xae,"(currentScope->GetFunc() == funcInfo)",
                                "currentScope->GetFunc() == funcInfo");
    if (!bVar2) goto LAB_008a33c0;
    *puVar4 = 0;
  }
  if ((funcInfo->root->fncFlags & kFunctionIsDeclaredInParamScope) != kFunctionNone) {
    if (pSVar6->scopeType != ScopeType_FunctionBody) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xb2,"(currentScope->GetScopeType() == ScopeType_FunctionBody)",
                                  "currentScope->GetScopeType() == ScopeType_FunctionBody");
      if (!bVar2) goto LAB_008a33c0;
      *puVar4 = 0;
    }
    if (pSVar6->enclosingScope == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xb3,"(currentScope->GetEnclosingScope())",
                                  "currentScope->GetEnclosingScope()");
      if (!bVar2) goto LAB_008a33c0;
      *puVar4 = 0;
    }
    pFVar5 = ByteCodeGenerator::GetEnclosingFuncInfo(byteCodeGenerator);
    if (pFVar5 == (FuncInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xb6,"(func)","func");
      if (!bVar2) goto LAB_008a33c0;
      *puVar4 = 0;
    }
    if (((pFVar5->field_0xb5 & 0x80) != 0) &&
       (pSVar6 = pFVar5->paramScope, pSVar6->scopeType != ScopeType_Parameter)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xbb,"(currentScope->GetScopeType() == ScopeType_Parameter)",
                                  "currentScope->GetScopeType() == ScopeType_Parameter");
      if (!bVar2) goto LAB_008a33c0;
      *puVar4 = 0;
    }
  }
  for (; pSVar6->func == funcInfo; pSVar6 = pSVar6->enclosingScope) {
  }
  ptr = SaveScopeInfo(byteCodeGenerator,pSVar6,byteCodeGenerator->scriptContext);
  if (ptr == (ScopeInfo *)0x0) {
    return;
  }
  if ((funcInfo->root->fncFlags & kFunctionIsDeclaredInParamScope) != kFunctionNone) {
    pFVar5 = ByteCodeGenerator::GetEnclosingFuncInfo(byteCodeGenerator);
    if (pFVar5 == (FuncInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xca,"(func)","func");
      if (!bVar2) goto LAB_008a33c0;
      *puVar4 = 0;
    }
    if ((pFVar5->field_0xb5 & 0x80) == 0) goto LAB_008a338f;
    if ((pSVar6 != pFVar5->paramScope) || (pSVar6->scopeType != ScopeType_Parameter)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xce,
                                  "(currentScope == func->GetParamScope() && currentScope->GetScopeType() == ScopeType_Parameter)"
                                  ,
                                  "currentScope == func->GetParamScope() && currentScope->GetScopeType() == ScopeType_Parameter"
                                 );
      if (!bVar2) goto LAB_008a33c0;
      *puVar4 = 0;
    }
    if (ptr->scopeType != ScopeType_Parameter) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xcf,"(scopeInfo->GetScopeType() == ScopeType_Parameter)",
                                  "scopeInfo->GetScopeType() == ScopeType_Parameter");
      if (!bVar2) goto LAB_008a33c0;
      *puVar4 = 0;
    }
    pSVar6 = pFVar5->bodyScope;
    if (pSVar6 == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0xd0,"(func->GetBodyScope())","func->GetBodyScope()");
      if (!bVar2) {
LAB_008a33c0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pSVar6 = pFVar5->bodyScope;
    }
    *(ushort *)&ptr->field_0x10 =
         (ushort)*(undefined4 *)&ptr->field_0x10 & 0xfffb | *(ushort *)&pSVar6->field_0x44 >> 2 & 4;
  }
LAB_008a338f:
  FunctionProxy::SetAuxPtr(&funcInfo->byteCodeFunction->super_FunctionProxy,ScopeInfo,ptr);
  return;
}

Assistant:

void ScopeInfo::SaveEnclosingScopeInfo(ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo)
    {
        // TODO: Not technically necessary, as we always do scope look up on eval if it is
        // not found in the scope chain, and block scopes are always objects in eval.
        // But if we save the global eval block scope for deferred child so that we can look up
        // let/const in that scope with slot index instead of doing a scope lookup.
        // We will have to implement encoding block scope info to enable, which will also
        // enable defer parsing function that are in block scopes.

        if (funcInfo->byteCodeFunction &&
            funcInfo->byteCodeFunction->GetScopeInfo() != nullptr)
        {
            // No need to regenerate scope info if we re-compile an enclosing function
            return;
        }

        Scope* currentScope = byteCodeGenerator->GetCurrentScope();
        Assert(currentScope->GetFunc() == funcInfo);

        if (funcInfo->root->IsDeclaredInParamScope())
        {
            Assert(currentScope->GetScopeType() == ScopeType_FunctionBody);
            Assert(currentScope->GetEnclosingScope());

            FuncInfo* func = byteCodeGenerator->GetEnclosingFuncInfo();
            Assert(func);

            if (func->IsBodyAndParamScopeMerged())
            {
                currentScope = func->GetParamScope();
                Assert(currentScope->GetScopeType() == ScopeType_Parameter);
            }
        }

        while (currentScope->GetFunc() == funcInfo)
        {
            currentScope = currentScope->GetEnclosingScope();
        }

        ScopeInfo * scopeInfo = ScopeInfo::SaveScopeInfo(byteCodeGenerator, currentScope, byteCodeGenerator->GetScriptContext());
        if (scopeInfo != nullptr)
        {
            if (funcInfo->root->IsDeclaredInParamScope())
            {
                FuncInfo* func = byteCodeGenerator->GetEnclosingFuncInfo();
                Assert(func);

                if (func->IsBodyAndParamScopeMerged())
                {
                    Assert(currentScope == func->GetParamScope() && currentScope->GetScopeType() == ScopeType_Parameter);
                    Assert(scopeInfo->GetScopeType() == ScopeType_Parameter);
                    Assert(func->GetBodyScope());

                    // If the current function is nested in the param scope of it's enclosing function we may have
                    // skipped the body scope and in may not be the scope stack but the body scope might still be
                    // in the frame display and we will need to account for it. See ByteCodeGenerateor::FindScopeForSym.
                    scopeInfo->mustInstantiate = func->GetBodyScope()->GetMustInstantiate();
                }
            }
            funcInfo->byteCodeFunction->SetScopeInfo(scopeInfo);
        }
    }